

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_resources_get_resource_list_for_type
          (spvc_resources resources,spvc_resource_type type,spvc_reflected_resource **resource_list,
          size_t *resource_size)

{
  spvc_context_s *this;
  spvc_reflected_resource *psVar1;
  allocator local_59;
  string local_58;
  VectorView<spvc_reflected_resource> *local_38;
  SmallVector<spvc_reflected_resource,_8UL> *list;
  size_t *resource_size_local;
  spvc_reflected_resource **resource_list_local;
  spvc_resources psStack_18;
  spvc_resource_type type_local;
  spvc_resources resources_local;
  
  local_38 = (VectorView<spvc_reflected_resource> *)0x0;
  switch(type) {
  case SPVC_RESOURCE_TYPE_UNIFORM_BUFFER:
    local_38 = &(resources->uniform_buffers).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_STORAGE_BUFFER:
    local_38 = &(resources->storage_buffers).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_STAGE_INPUT:
    local_38 = &(resources->stage_inputs).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_STAGE_OUTPUT:
    local_38 = &(resources->stage_outputs).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_SUBPASS_INPUT:
    local_38 = &(resources->subpass_inputs).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_STORAGE_IMAGE:
    local_38 = &(resources->storage_images).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_SAMPLED_IMAGE:
    local_38 = &(resources->sampled_images).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_ATOMIC_COUNTER:
    local_38 = &(resources->atomic_counters).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_PUSH_CONSTANT:
    local_38 = &(resources->push_constant_buffers).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_SEPARATE_IMAGE:
    local_38 = &(resources->separate_images).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_SEPARATE_SAMPLERS:
    local_38 = &(resources->separate_samplers).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_ACCELERATION_STRUCTURE:
    local_38 = &(resources->acceleration_structures).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_SHADER_RECORD_BUFFER:
    local_38 = &(resources->shader_record_buffers).super_VectorView<spvc_reflected_resource>;
    break;
  case SPVC_RESOURCE_TYPE_GL_PLAIN_UNIFORM:
    local_38 = &(resources->gl_plain_uniforms).super_VectorView<spvc_reflected_resource>;
  default:
  }
  list = (SmallVector<spvc_reflected_resource,_8UL> *)resource_size;
  resource_size_local = (size_t *)resource_list;
  resource_list_local._4_4_ = type;
  psStack_18 = resources;
  if (local_38 == (VectorView<spvc_reflected_resource> *)0x0) {
    this = resources->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Invalid argument.",&local_59);
    spvc_context_s::report_error(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    resources_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    psVar1 = (spvc_reflected_resource *)
             spirv_cross::VectorView<spvc_reflected_resource>::size(local_38);
    (list->super_VectorView<spvc_reflected_resource>).ptr = psVar1;
    psVar1 = spirv_cross::VectorView<spvc_reflected_resource>::data(local_38);
    *resource_size_local = (size_t)psVar1;
    resources_local._4_4_ = SPVC_SUCCESS;
  }
  return resources_local._4_4_;
}

Assistant:

spvc_result spvc_resources_get_resource_list_for_type(spvc_resources resources, spvc_resource_type type,
                                                      const spvc_reflected_resource **resource_list,
                                                      size_t *resource_size)
{
	const SmallVector<spvc_reflected_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_RESOURCE_TYPE_UNIFORM_BUFFER:
		list = &resources->uniform_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_BUFFER:
		list = &resources->storage_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->stage_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->stage_outputs;
		break;

	case SPVC_RESOURCE_TYPE_SUBPASS_INPUT:
		list = &resources->subpass_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_IMAGE:
		list = &resources->storage_images;
		break;

	case SPVC_RESOURCE_TYPE_SAMPLED_IMAGE:
		list = &resources->sampled_images;
		break;

	case SPVC_RESOURCE_TYPE_ATOMIC_COUNTER:
		list = &resources->atomic_counters;
		break;

	case SPVC_RESOURCE_TYPE_PUSH_CONSTANT:
		list = &resources->push_constant_buffers;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_IMAGE:
		list = &resources->separate_images;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_SAMPLERS:
		list = &resources->separate_samplers;
		break;

	case SPVC_RESOURCE_TYPE_ACCELERATION_STRUCTURE:
		list = &resources->acceleration_structures;
		break;

	case SPVC_RESOURCE_TYPE_SHADER_RECORD_BUFFER:
		list = &resources->shader_record_buffers;
		break;

	case SPVC_RESOURCE_TYPE_GL_PLAIN_UNIFORM:
		list = &resources->gl_plain_uniforms;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}